

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtree.cpp
# Opt level: O2

bool __thiscall DTreeParenthoodPropagator::propagate(DTreeParenthoodPropagator *this)

{
  _Rb_tree_node_base *p_Var1;
  _Rb_tree_color _Var2;
  BoolView *pBVar3;
  bool bVar4;
  int iVar5;
  _Base_ptr p_Var6;
  
  for (p_Var6 = (this->parenthood_fixed)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var6 != &(this->parenthood_fixed)._M_t._M_impl.super__Rb_tree_header;
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
    iVar5 = (*(this->super_DTreePropagator).super_DReachabilityPropagator.super_GraphPropagator.
              super_Propagator._vptr_Propagator[0x1b])(this,(ulong)p_Var6[1]._M_color);
    if ((char)iVar5 == '\0') {
      return false;
    }
    p_Var1 = p_Var6 + 1;
    iVar5 = IntVar::size((this->parents).data
                         [*(uint *)(*(long *)&(this->super_DTreePropagator).
                                              super_DReachabilityPropagator.super_GraphPropagator.
                                              endnodes.
                                              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start
                                              [(int)p_Var1->_M_color].
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data + 4)]);
    Tint::operator=(this->dom_size +
                    *(int *)(*(long *)&(this->super_DTreePropagator).super_DReachabilityPropagator.
                                       super_GraphPropagator.endnodes.
                                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start
                                       [(int)p_Var1->_M_color].
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data + 4),iVar5);
    _Var2 = p_Var1->_M_color;
    if ((this->super_DTreePropagator).super_DReachabilityPropagator.last_state_e[(int)_Var2].v != 0)
    {
      pBVar3 = (this->super_DTreePropagator).super_DReachabilityPropagator.super_GraphPropagator.es.
               data;
      if ((sat.assigns.data[(uint)pBVar3[_Var2].v] != '\0') &&
         (bVar4 = BoolView::isTrue(pBVar3 + _Var2), bVar4)) {
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        _M_insert_unique<int_const&>
                  ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                   &(this->super_DTreePropagator).super_DReachabilityPropagator.new_edge,
                   (int *)p_Var1);
      }
    }
  }
  p_Var6 = (this->parenthood_abandon)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    if ((_Rb_tree_header *)p_Var6 == &(this->parenthood_abandon)._M_t._M_impl.super__Rb_tree_header)
    {
      bVar4 = DTreePropagator::propagate(&this->super_DTreePropagator);
      return bVar4;
    }
    iVar5 = (*(this->super_DTreePropagator).super_DReachabilityPropagator.super_GraphPropagator.
              super_Propagator._vptr_Propagator[0x1a])(this,(ulong)p_Var6[1]._M_color);
    if ((char)iVar5 == '\0') break;
    p_Var1 = p_Var6 + 1;
    iVar5 = IntVar::size((this->parents).data
                         [*(uint *)(*(long *)&(this->super_DTreePropagator).
                                              super_DReachabilityPropagator.super_GraphPropagator.
                                              endnodes.
                                              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start
                                              [(int)p_Var1->_M_color].
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data + 4)]);
    Tint::operator=(this->dom_size +
                    *(int *)(*(long *)&(this->super_DTreePropagator).super_DReachabilityPropagator.
                                       super_GraphPropagator.endnodes.
                                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start
                                       [(int)p_Var1->_M_color].
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data + 4),iVar5);
    if ((this->super_DTreePropagator).super_DReachabilityPropagator.last_state_e
        [(int)p_Var1->_M_color].v != 1) {
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &(this->super_DTreePropagator).super_DReachabilityPropagator.rem_edge,(int *)p_Var1
                );
    }
    p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
  }
  return false;
}

Assistant:

bool DTreeParenthoodPropagator::propagate() {
	std::set<int>::iterator it;
	//*
	for (it = parenthood_fixed.begin(); it != parenthood_fixed.end(); ++it) {
		if (!propagateNewParent(*it)) {
			if (DEBUG) {
				std::cout << "False " << __FILE__ << __LINE__ << '\n';
			}
			return false;
		}
		dom_size[getHead(*it)] = parents[getHead(*it)]->size();
		if (last_state_e[*it] != VT_IN) {
			assert(getHead(*it) == getTail(*it) || getEdgeVar(*it).isFixed());
			assert(getHead(*it) == getTail(*it) || getEdgeVar(*it).isTrue());
			if (getEdgeVar(*it).isFixed() && getEdgeVar(*it).isTrue()) {
				new_edge.insert(*it);
			}
		}
	}

	for (it = parenthood_abandon.begin(); it != parenthood_abandon.end(); ++it) {
		if (!propagateRemParent(*it)) {
			if (DEBUG) {
				std::cout << "False " << __FILE__ << __LINE__ << '\n';
			}
			return false;
		}
		dom_size[getHead(*it)] = parents[getHead(*it)]->size();
		if (last_state_e[*it] != VT_OUT) {
			assert(getEdgeVar(*it).isFixed());
			assert(getEdgeVar(*it).isFalse());
			rem_edge.insert(*it);
		}
	}
	//*/

	if (!DTreePropagator::propagate()) {
		if (DEBUG) {
			std::cout << "False " << __FILE__ << __LINE__ << '\n';
		}
		return false;
	}

	return true;
}